

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_ws_context_free(ws_context_t *ctx)

{
  ws_context_t *ctx_local;
  
  nh_stream_free(&ctx->stream);
  if ((ctx->frame).payload != (char *)0x0) {
    free((ctx->frame).payload);
  }
  free(ctx);
  return;
}

Assistant:

void nh_ws_context_free(ws_context_t *ctx) {
    nh_stream_free(&ctx->stream);
    if (ctx->frame.payload != NULL) free(ctx->frame.payload);
    free(ctx);
}